

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapIndexBuilder.cpp
# Opt level: O2

void __thiscall BitmapIndexBuilder::save(BitmapIndexBuilder *this,string *fname)

{
  unsigned_long uVar1;
  uint64_t uVar2;
  long lVar3;
  uint32_t reserved;
  uint32_t ndx_type;
  uint32_t version;
  uint32_t magic;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_240;
  ofstream out;
  
  std::ofstream::ofstream(&out);
  std::ios::exceptions((int)&out + (int)*(undefined8 *)(_out + -0x18));
  std::ofstream::open((string *)&out,(_Ios_Openmode)fname);
  magic = 0xca7da7a;
  version = 6;
  ndx_type = (this->super_IndexBuilder).ntype;
  reserved = 0;
  std::ostream::write((char *)&out,(long)&magic);
  std::ostream::write((char *)&out,(long)&version);
  std::ostream::write((char *)&out,(long)&ndx_type);
  std::ostream::write((char *)&out,(long)&reserved);
  uVar1 = std::ostream::tellp();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&offsets,0x1000001,(allocator_type *)&local_240);
  for (lVar3 = 0; lVar3 != 0x1000000; lVar3 = lVar3 + 1) {
    offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[lVar3] = uVar1;
    get_run((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_240,this,(TriGram)lVar3);
    uVar2 = compress_run((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_240,
                         (ostream *)&out);
    uVar1 = uVar1 + uVar2;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_240);
  }
  offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[0x1000000] = uVar1;
  std::ostream::write((char *)&out,
                      (long)offsets.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::ofstream::~ofstream(&out);
  return;
}

Assistant:

void BitmapIndexBuilder::save(const std::string &fname) {
    std::ofstream out;
    out.exceptions(std::ofstream::badbit);
    out.open(fname, std::ofstream::binary);

    uint32_t magic = DB_MAGIC;
    uint32_t version = 6;
    auto ndx_type = static_cast<uint32_t>(index_type());
    uint32_t reserved = 0;

    out.write(reinterpret_cast<char *>(&magic), 4);
    out.write(reinterpret_cast<char *>(&version), 4);
    out.write(reinterpret_cast<char *>(&ndx_type), 4);
    out.write(reinterpret_cast<char *>(&reserved), 4);

    auto offset = static_cast<uint64_t>(out.tellp());
    std::vector<uint64_t> offsets(NUM_TRIGRAMS + 1);

    for (TriGram i = 0; i < NUM_TRIGRAMS; i++) {
        offsets[i] = offset;
        offset += compress_run(get_run(i), out);
    }

    offsets[NUM_TRIGRAMS] = offset;

    out.write(reinterpret_cast<char *>(offsets.data()),
              (NUM_TRIGRAMS + 1) * sizeof(uint64_t));
}